

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall
pstore::file::deleter_base::deleter_base(deleter_base *this,string *path,unlink_proc *unlinker)

{
  unlink_proc *unlinker_local;
  string *path_local;
  deleter_base *this_local;
  
  this->_vptr_deleter_base = (_func_int **)&PTR__deleter_base_001a2548;
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->unlinker_,unlinker);
  this->released_ = false;
  return;
}

Assistant:

deleter_base::deleter_base (std::string path, unlink_proc unlinker)
                : path_{std::move (path)}
                , unlinker_{std::move (unlinker)} {}